

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

void __thiscall Al::internal::ProgressEngine::enqueue(ProgressEngine *this,AlState *state)

{
  __int_type_conflict _Var1;
  __int_type_conflict _Var2;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  InputQueue *pIVar6;
  
  if (((this->started_flag)._M_base._M_i & 1U) == 0) {
    run(this);
  }
  _Var1 = (this->num_input_streams).super___atomic_base<unsigned_long>._M_i;
  lVar5 = _Var1 + 1;
  pIVar6 = (InputQueue *)&this[-1].request_queues[0x3f].q.back;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      pvVar4 = (void *)(**(code **)(*(long *)state + 0x20))(state);
      pIVar6 = this->request_queues + _Var1;
      this->request_queues[_Var1].compute_stream = pvVar4;
      LOCK();
      (this->num_input_streams).super___atomic_base<unsigned_long>._M_i =
           (this->num_input_streams).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      break;
    }
    pvVar4 = pIVar6[1].compute_stream;
    pIVar6 = pIVar6 + 1;
    pvVar3 = (void *)(**(code **)(*(long *)state + 0x20))(state);
  } while (pvVar4 != pvVar3);
  _Var1 = (pIVar6->q).back.super___atomic_base<unsigned_long>._M_i;
  _Var2 = (pIVar6->q).size;
  (pIVar6->q).data[_Var1] = state;
  (pIVar6->q).back.super___atomic_base<unsigned_long>._M_i = _Var2 - 1 & _Var1 + 1;
  return;
}

Assistant:

void ProgressEngine::enqueue(AlState* state) {
#ifdef AL_PE_START_ON_DEMAND
  if (!started_flag.load()) {
    run();
  }
#endif
#ifdef AL_PE_STREAM_QUEUE_CACHE
  // Check the thread-local queue cache.
  auto iter = ProgressEngine::stream_to_queue.find(state->get_compute_stream());
  if (iter != ProgressEngine::stream_to_queue.end()) {
    iter->second->q.push(state);
    return;
  }
  const size_t local_num_input_streams = num_input_streams.load();
#else
  // Linear search to find the queue.
  const size_t local_num_input_streams = num_input_streams.load();
  for (size_t i = 0; i < local_num_input_streams; ++i) {
    if (request_queues[i].compute_stream == state->get_compute_stream()) {
      // Appropriate queue found, we can just enqueue.
      request_queues[i].q.push(state);
      return;
    }
  }
#endif
  // Queue was not found, so we need to create it.
#ifdef AL_THREAD_MULTIPLE
  add_queue_mutex.lock();
  // Check if some other thread added the queue.
  const size_t locked_local_num_input_streams = num_input_streams.load();
  for (size_t i = local_num_input_streams;
       i < locked_local_num_input_streams;
       ++i) {
    if (request_queues[i].compute_stream == state->get_compute_stream()) {
      // Queue was added.
      add_queue_mutex.unlock();
      request_queues[i].q.push(state);
#ifdef AL_PE_STREAM_QUEUE_CACHE
      // Update cache.
      ProgressEngine::stream_to_queue[state->get_compute_stream()] = &request_queues[i];
#endif
      return;
    }
  }
#else
  // When there is only one thread, if the queue was not found earlier,
  // we always have to create it.
  const size_t locked_local_num_input_streams = local_num_input_streams;
#endif
#ifdef AL_DEBUG
  // Ensure we do not try to use too many queues.
  if (locked_local_num_input_streams >= AL_PE_NUM_STREAMS) {
    throw_al_exception(
      "Trying to create more progress engine streams than supported");
  }
#endif
  // Add the new queue.
  request_queues[locked_local_num_input_streams].compute_stream = state->get_compute_stream();
  ++num_input_streams;  // Make new queue visible.
#ifdef AL_THREAD_MULTIPLE
  add_queue_mutex.unlock();
#endif
  request_queues[locked_local_num_input_streams].q.push(state);
#ifdef AL_PE_STREAM_QUEUE_CACHE
  ProgressEngine::stream_to_queue[state->get_compute_stream()] = &request_queues[locked_local_num_input_streams];
#endif
}